

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

uint64_t __thiscall roaring::Roaring64Map::rank(Roaring64Map *this,uint64_t x)

{
  const_iterator cVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  _Base_ptr p_Var4;
  key_type local_24;
  
  cVar1 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
          ::lower_bound((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                         *)this,&local_24);
  if (((_Rb_tree_header *)cVar1._M_node == &(this->roarings)._M_t._M_impl.super__Rb_tree_header) ||
     (cVar1._M_node[1]._M_color != (_Rb_tree_color)(x >> 0x20))) {
    uVar2 = 0;
  }
  else {
    uVar2 = Roaring::rank((Roaring *)&cVar1._M_node[1]._M_parent,(uint32_t)x);
  }
  for (p_Var4 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var4 != cVar1._M_node; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    uVar3 = Roaring::cardinality((Roaring *)&p_Var4[1]._M_parent);
    uVar2 = uVar2 + uVar3;
  }
  return uVar2;
}

Assistant:

uint64_t rank(uint64_t x) const {
        uint64_t result = 0;
        // Find the first bitmap >= x's bucket. If that is the bucket x would be
        // in, find it's rank in that bucket. Either way, we're left with a
        // range of all buckets strictly smaller than x's bucket, add all their
        // cardinalities together.
        auto end = roarings.lower_bound(highBytes(x));
        if (end != roarings.cend() && end->first == highBytes(x)) {
            result += end->second.rank(lowBytes(x));
        }
        for (auto iter = roarings.cbegin(); iter != end; ++iter) {
            result += iter->second.cardinality();
        }
        return result;
    }